

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

unsigned_short jsteemann::atoi_unchecked<unsigned_short>(char *p,char *e)

{
  unsigned_short uVar1;
  
  if ((p != e) && (*p != '-')) {
    if (*p == '+') {
      uVar1 = atoi_positive_unchecked<unsigned_short>(p + 1,e);
      return uVar1;
    }
    uVar1 = 0;
    for (; p != e; p = p + 1) {
      uVar1 = (uVar1 * 10 + (short)*p) - 0x30;
    }
    return uVar1;
  }
  return 0;
}

Assistant:

inline T atoi_unchecked(char const* p, char const* e) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    return T();
  }

  if (*p == '-') {
    if (!std::is_signed<T>::value) {
      return T();
    }
    return atoi_negative_unchecked<T>(++p, e);
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive_unchecked<T>(p, e);
}